

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

void __thiscall
CMU462::Timeline::drawButton(Timeline *this,int element_type,double x,double y,double size)

{
  double dVar1;
  double x1;
  double x2;
  double y1;
  double y2;
  double cx;
  double cy;
  double x2_00;
  double x1_00;
  double x_mid_r;
  double x_mid_l;
  double y_mid;
  double x_mid;
  double y_down;
  double y_up;
  double x_right;
  double x_left;
  double border_size;
  double size_local;
  double y_local;
  double x_local;
  int element_type_local;
  Timeline *this_local;
  
  dVar1 = size / 10.0;
  x1 = x + dVar1;
  x2 = (x + size) - dVar1;
  y1 = y + dVar1;
  y2 = (y + size) - dVar1;
  cx = (x1 + x2) * 0.5;
  cy = (y1 + y2) * 0.5;
  x2_00 = cx - dVar1 * 0.5;
  x1_00 = cx + dVar1 * 0.5;
  switch(element_type) {
  case 0:
    drawTriangle(this,x1,cy,x2_00,y1,x2_00,y2);
    drawTriangle(this,x1_00,cy,x2,y1,x2,y2);
    break;
  case 1:
    drawRectangle(this,x1,y1,x2,y2);
    break;
  case 2:
    drawTriangle(this,x1,y1,x2,cy,x1,y2);
    break;
  case 3:
    drawTriangle(this,x1,cy,x2_00,y1,x2_00,y2);
    drawRectangle(this,x1_00,y1,x2,y2);
    break;
  case 4:
    drawRectangle(this,x1,y1,x2_00,y2);
    drawTriangle(this,x1_00,y1,x2,cy,x1_00,y2);
    break;
  case 5:
    drawCircle(this,cx,cy,-dVar1 + -dVar1 + size / 2.0,0x14);
  }
  return;
}

Assistant:

void Timeline::drawButton(int element_type, double x, double y, double size)
  {

	double border_size = size/10.0;
	double x_left  = x + border_size;
	double x_right = x + size - border_size;
	double y_up    = y + border_size;
	double y_down  = y + size - border_size;

	double x_mid = (x_left + x_right) /2.0;
	double y_mid = (y_up + y_down)    /2.0;


	double x_mid_l = x_mid - border_size/2;
	double x_mid_r = x_mid + border_size/2;

	switch(element_type){

	case REWIND:

	  drawTriangle(x_left,  y_mid,
				   x_mid_l, y_up,
				   x_mid_l, y_down);

	  drawTriangle(x_mid_r, y_mid,
				   x_right, y_up,
				   x_right, y_down);

	  break;

	case STOP:

	  drawRectangle(x_left, y_up, x_right, y_down);

	  break;

	case PLAY:

	  drawTriangle(x_left,  y_up,
				   x_right, y_mid,
				   x_left,  y_down);
	  break;

	case STEP_BACK:

	  drawTriangle(x_left,  y_mid,
				   x_mid_l, y_up,
				   x_mid_l, y_down);

	  drawRectangle(x_mid_r, y_up, x_right, y_down);
	  break;

	case STEP_FORWARD:

	  drawRectangle(x_left, y_up, x_mid_l, y_down);

	  drawTriangle(x_mid_r, y_up,
				   x_right, y_mid,
				   x_mid_r, y_down);
	  break;

	case LOOP:

	  drawCircle(x_mid, y_mid, size/2 - border_size*2, 20);

	  /*
		STEP_BACK    = 3,
		STEP_FORWARD = 4,
		TIMELINE     = 5,
		LOOP         = 7,
		NONE         = 6
	  */

	}

  }